

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newpfor.h
# Opt level: O0

void __thiscall
FastPForLib::NewPFor<4U,_FastPForLib::Simple16<false>_>::encodeArray
          (NewPFor<4U,_FastPForLib::Simple16<false>_> *this,uint32_t *in,size_t len,uint32_t *out,
          size_t *nvalue)

{
  ulong uVar1;
  uint32_t uVar2;
  ostream *this_00;
  uint32_t *in_RCX;
  uint32_t in_EDX;
  long in_RSI;
  long *in_RDI;
  ulong *in_R8;
  uint32_t i;
  uint32_t numBlocks;
  size_t initnvalue;
  size_t csize;
  uint32_t in_stack_0000018c;
  size_t in_stack_00000190;
  uint local_40;
  long local_30;
  ulong *local_28;
  uint32_t *local_20;
  uint32_t local_18;
  long local_10;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_18 = in_EDX;
  checkifdivisibleby(in_stack_00000190,in_stack_0000018c);
  uVar1 = *local_28;
  uVar2 = div_roundup(local_18,0x80);
  *local_20 = uVar2;
  *local_28 = 1;
  local_20 = local_20 + 1;
  for (local_40 = 0; local_40 < uVar2; local_40 = local_40 + 1) {
    (**(code **)(*in_RDI + 0x50))(in_RDI,local_10,local_20,&local_30);
    local_10 = local_10 + 0x200;
    local_20 = local_20 + local_30;
    *local_28 = local_30 + *local_28;
  }
  if (uVar1 < *local_28) {
    this_00 = std::operator<<((ostream *)&std::cerr," we have a possible buffer overrun");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void NewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::encodeArray(
    const uint32_t *in, const size_t len, uint32_t *out, size_t &nvalue) {
  size_t csize;
#ifndef NDEBUG
  const uint32_t *const initin(in);
  const uint32_t *const initout(out);
#endif
  checkifdivisibleby(len, BlockSize);
  const size_t initnvalue = nvalue;

  uint32_t numBlocks = div_roundup(static_cast<uint32_t>(len), BlockSize);

  /* Output the number of blocks */
  *out++ = numBlocks;
  nvalue = 1;
#ifdef STATS
  std::vector<uint32_t> stats(33, 0);
#endif
  for (uint32_t i = 0; i < numBlocks; i++) {
#ifdef STATS
    stats[findBestB(in, BlockSize)]++;
#endif

    encodeBlock(in, out, csize);
    in += BlockSize;
    out += csize;
    nvalue += csize;
  }
#ifdef STATS
  for (uint32_t k = 0; k < 33; ++k)
    cout << "newpfor b=" << k << " " << stats[k] << endl;
#endif
  if (nvalue > initnvalue) {
    std::cerr << " we have a possible buffer overrun" << std::endl;
  }
  ASSERT(len == static_cast<size_t>(in - initin), len << " " << (in - initin));
  ASSERT(nvalue == static_cast<size_t>(out - initout),
         nvalue << " " << (out - initout));
}